

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pFVar5 = (this->left_->fadexpr_).expr_.fadexpr_.right_;
  dVar1 = (this->left_->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar2 = (pFVar5->dx_).ptr_to_data[i];
  dVar6 = cos(dVar1 * pFVar5->val_);
  dVar7 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar5 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar3 = (this->right_->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar4 = (pFVar5->dx_).ptr_to_data[i];
  dVar8 = cos(dVar3 * pFVar5->val_);
  dVar9 = sin((this->left_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->left_->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar9 * dVar8 * dVar4 * dVar3 + dVar7 * dVar6 * dVar2 * dVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}